

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi_load_gif_from_memory
                    (stbi_uc *buffer,int len,int **delays,int *x,int *y,int *z,int *comp,
                    int req_comp)

{
  stbi__context *s_00;
  int h;
  int bytes_per_pixel;
  bool bVar1;
  uint uVar2;
  int iVar3;
  stbi__context *__src;
  stbi_uc *psVar4;
  int *piVar5;
  long lVar6;
  uint uVar7;
  int *piVar8;
  int iVar9;
  long *in_FS_OFFSET;
  stbi__context s;
  stbi_uc *local_89b0;
  stbi__context local_8980;
  stbi__gif local_88a0;
  
  local_8980.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  local_8980.read_from_callbacks = 0;
  local_8980.callback_already_read = 0;
  local_8980.img_buffer_end = buffer + len;
  piVar8 = y;
  local_8980.img_buffer = buffer;
  local_8980.img_buffer_original = buffer;
  local_8980.img_buffer_original_end = local_8980.img_buffer_end;
  iVar3 = stbi__gif_test(&local_8980);
  if (iVar3 == 0) {
    in_FS_OFFSET[-4] = (long)"not GIF";
    local_89b0 = (uchar *)0x0;
  }
  else {
    memset(&local_88a0,0,0x8870);
    if (delays != (int **)0x0) {
      *delays = (int *)0x0;
    }
    local_89b0 = (stbi_uc *)0x0;
    lVar6 = 0;
    uVar2 = 0;
    do {
      s_00 = &local_8980;
      __src = (stbi__context *)
              stbi__gif_load_next(s_00,&local_88a0,comp,(int)lVar6,(stbi_uc *)piVar8);
      uVar7 = uVar2;
      if (__src != (stbi__context *)0x0 && __src != s_00) {
        *x = local_88a0.w;
        *y = local_88a0.h;
        uVar7 = uVar2 + 1;
        iVar9 = local_88a0.h * local_88a0.w;
        iVar3 = iVar9 * 4;
        if (local_89b0 == (stbi_uc *)0x0) {
          local_89b0 = (stbi_uc *)malloc((long)(int)(iVar3 * uVar7));
          if (local_89b0 == (stbi_uc *)0x0) {
            stbi__load_gif_main_outofmem(&local_88a0,(stbi_uc *)0x0,delays);
            goto LAB_00105103;
          }
          if (delays != (int **)0x0) {
            piVar5 = (int *)malloc((long)(int)uVar7 << 2);
            *delays = piVar5;
            if (piVar5 == (int *)0x0) {
              stbi__load_gif_main_outofmem(&local_88a0,local_89b0,delays);
              local_89b0 = (uchar *)0x0;
              goto LAB_0010510f;
            }
          }
        }
        else {
          psVar4 = (stbi_uc *)realloc(local_89b0,(long)(int)(iVar3 * uVar7));
          if (psVar4 == (stbi_uc *)0x0) {
            stbi__load_gif_main_outofmem(&local_88a0,local_89b0,delays);
            bVar1 = false;
          }
          else {
            local_89b0 = psVar4;
            if (delays != (int **)0x0) {
              piVar5 = (int *)realloc(*delays,(long)(int)uVar7 << 2);
              if (piVar5 == (int *)0x0) {
                stbi__load_gif_main_outofmem(&local_88a0,psVar4,delays);
                bVar1 = false;
                goto LAB_00104fda;
              }
              *delays = piVar5;
            }
            bVar1 = true;
          }
LAB_00104fda:
          if (!bVar1) {
LAB_00105103:
            local_89b0 = (uchar *)0x0;
            goto LAB_0010510f;
          }
        }
        memcpy(local_89b0 + (int)(iVar3 * uVar2),__src,(long)iVar3);
        if (0 < (int)uVar2) {
          lVar6 = (long)local_89b0 - (long)(iVar9 * 8);
        }
        if (delays != (int **)0x0) {
          (*delays)[uVar2] = local_88a0.delay;
        }
      }
      uVar2 = uVar7;
    } while (__src != (stbi__context *)0x0 && __src != s_00);
    free(local_88a0.out);
    free(local_88a0.history);
    free(local_88a0.background);
    if ((req_comp & 0xfffffffbU) != 0) {
      local_89b0 = stbi__convert_format(local_89b0,4,req_comp,local_88a0.w * uVar2,local_88a0.h);
    }
    *z = uVar2;
  }
LAB_0010510f:
  piVar8 = &stbi__vertically_flip_on_load_global;
  if (*(int *)((long)in_FS_OFFSET + -0x14) != 0) {
    piVar8 = (int *)(*in_FS_OFFSET + -0x18);
  }
  if ((*piVar8 != 0) && (iVar3 = *z, 0 < iVar3)) {
    iVar9 = *x;
    h = *y;
    bytes_per_pixel = *comp;
    psVar4 = local_89b0;
    do {
      stbi__vertical_flip(psVar4,iVar9,h,bytes_per_pixel);
      psVar4 = psVar4 + h * iVar9 * bytes_per_pixel;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return local_89b0;
}

Assistant:

STBIDEF stbi_uc *stbi_load_gif_from_memory(stbi_uc const *buffer, int len, int **delays, int *x, int *y, int *z, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s;
   stbi__start_mem(&s,buffer,len);

   result = (unsigned char*) stbi__load_gif_main(&s, delays, x, y, z, comp, req_comp);
   if (stbi__vertically_flip_on_load) {
      stbi__vertical_flip_slices( result, *x, *y, *z, *comp );
   }

   return result;
}